

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_metadata.cpp
# Opt level: O1

bool __thiscall
handlegraph::PathMetadata::for_each_step_of_sense_impl
          (PathMetadata *this,handle_t *visited,PathSense *sense,
          function<bool_(const_handlegraph::step_handle_t_&)> *iteratee)

{
  int iVar1;
  undefined8 *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48 = (undefined8 *)0x0;
  uStack_40 = 0;
  local_48 = (undefined8 *)operator_new(0x18);
  *local_48 = this;
  local_48[1] = sense;
  local_48[2] = iteratee;
  pcStack_30 = std::
               _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/path_metadata.cpp:362:50)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<bool_(const_handlegraph::step_handle_t_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vgteam[P]libhandlegraph/src/path_metadata.cpp:362:50)>
             ::_M_manager;
  iVar1 = (*this->_vptr_PathMetadata[0xd])(this,visited,&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  return SUB41(iVar1,0);
}

Assistant:

bool PathMetadata::for_each_step_of_sense_impl(const handle_t& visited, const PathSense& sense, const std::function<bool(const step_handle_t&)>& iteratee) const {
    return for_each_step_on_handle_impl(visited, [&](const step_handle_t& handle) {
        if (get_sense(get_path_handle_of_step(handle)) != sense) {
            // Skip this non-matching path's step
            return true;
        }
        // And emit any steps on matching paths
        return iteratee(handle);
    });
}